

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void get_top_weights<dense_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,dense_parameters *weights)

{
  float _x;
  uint64_t uVar1;
  undefined4 uVar2;
  ulong uVar3;
  size_t sVar4;
  float *pfVar5;
  char *pcVar6;
  const_reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *in_RCX;
  int in_EDX;
  int __c;
  int in_ESI;
  long in_RDI;
  int i_2;
  weight v;
  uint64_t i_1;
  uint64_t i;
  iterator iter;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  anon_class_1_0_00000001 cmp;
  uint64_t length;
  dense_parameters *in_stack_fffffffffffffef0;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *this;
  value_type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff08;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *in_stack_ffffffffffffff10;
  dense_iterator<float> *this_00;
  int local_cc;
  feature local_c8;
  float local_b4;
  char *local_b0;
  feature local_a8;
  ulong local_98;
  dense_iterator<float> local_90;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *local_28;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *local_18;
  int local_10;
  int local_c;
  
  local_28 = (char *)(1L << (*(byte *)(in_RDI + 0x50) & 0x3f));
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<feature,_std::allocator<feature>_>::vector
            ((vector<feature,_std::allocator<feature>_> *)0x21b221);
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (vector<feature,_std::allocator<feature>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::vector<feature,_std::allocator<feature>_>::~vector
            ((vector<feature,_std::allocator<feature>_> *)in_stack_fffffffffffffef0);
  dense_parameters::begin(in_stack_fffffffffffffef0);
  local_98 = 0;
  while( true ) {
    uVar3 = local_98;
    pcVar6 = local_28;
    sVar4 = min((long)local_c,(size_t)local_28);
    if (sVar4 <= uVar3) break;
    this_00 = &local_90;
    pfVar5 = dense_iterator<float>::operator*(this_00);
    _x = pfVar5[local_10];
    pcVar6 = dense_iterator<float>::index(this_00,pcVar6,__c);
    feature::feature(&local_a8,_x,(uint64_t)pcVar6);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
    local_98 = local_98 + 1;
    dense_iterator<float>::operator++(&local_90);
  }
  local_b0 = (char *)(long)local_c;
  while (local_b0 < local_28) {
    pfVar5 = dense_iterator<float>::operator*(&local_90);
    in_stack_ffffffffffffff04 = pfVar5[local_10];
    local_b4 = in_stack_ffffffffffffff04;
    pvVar7 = std::
             priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
             ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                    *)0x21b3cb);
    if (pvVar7->x <= in_stack_ffffffffffffff04 && in_stack_ffffffffffffff04 != pvVar7->x) {
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
             *)in_stack_fffffffffffffef0);
      feature::feature(&local_c8,local_b4,(uint64_t)local_b0);
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
              *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
    }
    local_b0 = local_b0 + 1;
    dense_iterator<float>::operator++(&local_90);
  }
  this = local_18;
  sVar8 = std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
          ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                  *)0x21b45a);
  std::vector<feature,_std::allocator<feature>_>::resize
            ((vector<feature,_std::allocator<feature>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),sVar8);
  sVar8 = std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
          ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                  *)0x21b47f);
  local_cc = (int)sVar8;
  while (local_cc = local_cc + -1, -1 < local_cc) {
    pvVar7 = std::
             priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
             ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                    *)0x21b4a6);
    pvVar9 = std::vector<feature,_std::allocator<feature>_>::operator[](&local_18->c,(long)local_cc)
    ;
    uVar2 = *(undefined4 *)&pvVar7->field_0x4;
    uVar1 = pvVar7->weight_index;
    pvVar9->x = pvVar7->x;
    *(undefined4 *)&pvVar9->field_0x4 = uVar2;
    pvVar9->weight_index = uVar1;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(this);
  }
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::~priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                     *)0x21b4f5);
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}